

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDocumentation.cxx
# Opt level: O2

bool __thiscall cmDocumentation::PrintHelpOneManual(cmDocumentation *this,ostream *os)

{
  bool bVar1;
  bool bVar2;
  ostream *poVar3;
  cmDocumentation *pcVar4;
  string mname;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  undefined1 local_60 [32];
  
  std::__cxx11::string::string((string *)&local_a0,(string *)&this->CurrentArgument);
  if (((3 < local_a0._M_string_length) &&
      (local_a0._M_dataplus._M_p[local_a0._M_string_length - 3] == '(')) &&
     (local_a0._M_dataplus._M_p[local_a0._M_string_length - 1] == ')')) {
    std::__cxx11::string::substr((ulong)&local_80,(ulong)&local_a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   &local_80,".");
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &stack0xffffffffffffffc0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_60,
                   local_a0._M_dataplus._M_p[local_a0._M_string_length - 2]);
    std::__cxx11::string::operator=((string *)&local_a0,(string *)&stack0xffffffffffffffc0);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  pcVar4 = (cmDocumentation *)&stack0xffffffffffffffc0;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar4,
                 "manual/",&local_a0);
  bVar1 = PrintFiles(pcVar4,os,(string *)&stack0xffffffffffffffc0);
  bVar2 = true;
  if (!bVar1) {
    std::operator+(&local_80,"manual/",&local_a0);
    pcVar4 = (cmDocumentation *)local_60;
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)pcVar4,
                   &local_80,".[0-9]");
    bVar2 = PrintFiles(pcVar4,os,(string *)local_60);
    std::__cxx11::string::~string((string *)local_60);
    std::__cxx11::string::~string((string *)&local_80);
  }
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc0);
  if (bVar2 == false) {
    poVar3 = std::operator<<(os,"Argument \"");
    poVar3 = std::operator<<(poVar3,(string *)&this->CurrentArgument);
    poVar3 = std::operator<<(poVar3,"\" to --help-manual is not an available manual.  ");
    std::operator<<(poVar3,"Use --help-manual-list to see all available manuals.\n");
  }
  std::__cxx11::string::~string((string *)&local_a0);
  return bVar2;
}

Assistant:

bool cmDocumentation::PrintHelpOneManual(std::ostream& os)
{
  std::string mname = this->CurrentArgument;
  std::string::size_type mlen = mname.length();
  if(mlen > 3 && mname[mlen-3] == '(' &&
                 mname[mlen-1] == ')')
    {
    mname = mname.substr(0, mlen-3) + "." + mname[mlen-2];
    }
  if(this->PrintFiles(os, "manual/" + mname) ||
     this->PrintFiles(os, "manual/" + mname + ".[0-9]"))
    {
    return true;
    }
  // Argument was not a manual.  Complain.
  os << "Argument \"" << this->CurrentArgument
     << "\" to --help-manual is not an available manual.  "
     << "Use --help-manual-list to see all available manuals.\n";
  return false;
}